

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsioContextManager.cpp
# Opt level: O3

LoopHandle __thiscall
gmlc::networking::AsioContextManager::runContextLoop(AsioContextManager *this,string *contextName)

{
  _Base_ptr this_00;
  iterator iVar1;
  invalid_argument *this_01;
  unique_lock<std::mutex> ctxlock;
  unique_lock<std::mutex> local_28;
  
  local_28._M_device = (mutex_type *)contextLock;
  local_28._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>_>_>_>
                  *)contexts_abi_cxx11_,contextName);
  if (iVar1._M_node != (_Base_ptr)(contexts_abi_cxx11_ + 8)) {
    this_00 = iVar1._M_node[2]._M_parent;
    if (this_00 != (_Base_ptr)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&this_00->_M_parent = *(int *)&this_00->_M_parent + 1;
        UNLOCK();
      }
      else {
        *(int *)&this_00->_M_parent = *(int *)&this_00->_M_parent + 1;
      }
    }
    std::unique_lock<std::mutex>::unlock(&local_28);
    startContextLoop(this);
    if (this_00 != (_Base_ptr)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_28);
    return (__uniq_ptr_data<gmlc::networking::AsioContextManager::Servicer,_std::default_delete<gmlc::networking::AsioContextManager::Servicer>,_true,_true>
            )(__uniq_ptr_data<gmlc::networking::AsioContextManager::Servicer,_std::default_delete<gmlc::networking::AsioContextManager::Servicer>,_true,_true>
              )this;
  }
  this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_01,"the context name specified was not available");
  __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

AsioContextManager::LoopHandle
    AsioContextManager::runContextLoop(const std::string& contextName)
{
    std::unique_lock<std::mutex> ctxlock(contextLock);
    auto fnd = contexts.find(contextName);
    if (fnd != contexts.end()) {
        auto ptr = fnd->second;
        ctxlock.unlock();
        return ptr->startContextLoop();
    }
    throw(
        std::invalid_argument("the context name specified was not available"));
}